

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::StripLeft(FString *this,char *charset)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  size_t len;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  pcVar1 = this->Chars;
  uVar3 = (ulong)*(uint *)(pcVar1 + -0xc);
  if (uVar3 == 0) {
    return;
  }
  uVar4 = 0;
  do {
    uVar5 = uVar3;
    if (uVar3 == uVar4) {
LAB_0054680d:
      if (*(int *)(pcVar1 + -4) < 2) {
        for (lVar6 = 0; lVar6 + uVar5 <= uVar3; lVar6 = lVar6 + 1) {
          this->Chars[lVar6] = this->Chars[uVar5 + lVar6];
        }
        ReallocBuffer(this,lVar6 - 1);
        return;
      }
      len = uVar3 - uVar5;
      AllocBuffer(this,len);
      pcVar2 = this->Chars;
      memcpy(pcVar2,pcVar1 + uVar5,len);
      pcVar2[len] = '\0';
      FStringData::Release((FStringData *)(pcVar1 + -0xc));
      return;
    }
    pcVar2 = strchr(charset,(int)pcVar1[uVar4]);
    if (pcVar2 == (char *)0x0) {
      uVar5 = uVar4;
      if (uVar4 == 0) {
        return;
      }
      goto LAB_0054680d;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}